

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_asn1_bitstring_has_bit(CBS *cbs,uint bit)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  bool local_25;
  uint bit_num;
  uint byte_num;
  uint bit_local;
  CBS *cbs_local;
  
  iVar1 = CBS_is_valid_asn1_bitstring(cbs);
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    uVar2 = (bit >> 3) + 1;
    sVar3 = CBS_len(cbs);
    local_25 = false;
    if (uVar2 < sVar3) {
      puVar4 = CBS_data(cbs);
      local_25 = ((uint)puVar4[uVar2] & 1 << (7 - ((byte)bit & 7) & 0x1f)) != 0;
    }
    cbs_local._4_4_ = (uint)local_25;
  }
  return cbs_local._4_4_;
}

Assistant:

int CBS_asn1_bitstring_has_bit(const CBS *cbs, unsigned bit) {
  if (!CBS_is_valid_asn1_bitstring(cbs)) {
    return 0;
  }

  const unsigned byte_num = (bit >> 3) + 1;
  const unsigned bit_num = 7 - (bit & 7);

  // Unused bits are zero, and this function does not distinguish between
  // missing and unset bits. Thus it is sufficient to do a byte-level length
  // check.
  return byte_num < CBS_len(cbs) &&
         (CBS_data(cbs)[byte_num] & (1 << bit_num)) != 0;
}